

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O3

bool Function_Template::form7_Threshold(ThresholdDoubleForm3 Threshold)

{
  byte value;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  Image output;
  Image input;
  
  value = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&output,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&input,value,0,0,&output);
  output._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&output);
  Unit_Test::generateRoi(&input,&roiX,&roiY,&roiWidth,&roiHeight);
  uVar2 = rand();
  uVar2 = uVar2 / 0xff + (uVar2 / 0xff) * -0x100 + uVar2;
  uVar3 = rand();
  uVar3 = uVar3 / 0xff + (uVar3 / 0xff) * -0x100 + uVar3;
  if (uVar3 <= uVar2) {
    uVar3 = uVar2;
  }
  (*Threshold)(&output,&input,roiX,roiY,roiWidth,roiHeight,(byte)uVar2,(byte)uVar3);
  bVar1 = Unit_Test::equalSize(&output,roiWidth,roiHeight);
  if (bVar1) {
    bVar1 = Unit_Test::verifyImage(&output,-(value <= (byte)uVar3 && (byte)uVar2 <= value));
  }
  else {
    bVar1 = false;
  }
  output._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&output);
  input._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&input);
  return bVar1;
}

Assistant:

bool form7_Threshold(ThresholdDoubleForm3 Threshold)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image input = uniformImage( intensity );

        uint32_t roiX, roiY, roiWidth, roiHeight;
        generateRoi( input, roiX, roiY, roiWidth, roiHeight );

        const uint8_t minThreshold = randomValue <uint8_t>( 255 );
        const uint8_t maxThreshold = randomValue <uint8_t>( minThreshold, 255 );

        const PenguinV_Image::Image output = Threshold( input, roiX, roiY, roiWidth, roiHeight, minThreshold, maxThreshold );

        return equalSize( output, roiWidth, roiHeight ) &&
            verifyImage( output, intensity < minThreshold || intensity > maxThreshold ? 0 : 255 );
    }